

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUndefFunctionCall
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst,
          Function *func)

{
  Value *val;
  Value *val_00;
  long lVar1;
  const_iterator cVar2;
  long *plVar3;
  pointer pcVar4;
  PSNode *n;
  _Rb_tree_color type;
  CallInst *pCVar5;
  undefined1 auVar6 [16];
  uint64_t lenVal;
  PSNode *local_60;
  key_type local_58;
  PSNode *local_38;
  
  if (this[0x149] == (LLVMPointerGraphBuilder)0x1) {
    auVar6 = llvm::Value::getName();
    if ((auVar6._8_8_ == 4) && (*auVar6._0_8_ == 0x65657266)) {
      local_60 = createFree(this,(Instruction *)CInst);
      goto LAB_00121760;
    }
  }
  if (this[0x14a] == (LLVMPointerGraphBuilder)0x1) {
    auVar6 = llvm::Value::getName();
    if ((auVar6._8_8_ == 0xe) &&
       (*(long *)((long)auVar6._0_8_ + 6) == 0x6574616572635f64 &&
        *auVar6._0_8_ == 0x5f64616572687470)) {
      createPthreadCreate(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
    auVar6 = llvm::Value::getName();
    if ((auVar6._8_8_ == 0xc) &&
       ((int)auVar6._0_8_[1] == 0x6e696f6a && *auVar6._0_8_ == 0x5f64616572687470)) {
      createPthreadJoin(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
    auVar6 = llvm::Value::getName();
    if ((auVar6._8_8_ == 0xc) &&
       ((int)auVar6._0_8_[1] == 0x74697865 && *auVar6._0_8_ == 0x5f64616572687470)) {
      createPthreadExit(__return_storage_ptr__,this,CInst);
      return __return_storage_ptr__;
    }
  }
  auVar6 = llvm::Value::getName();
  lVar1 = auVar6._0_8_;
  if (lVar1 == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,lVar1,auVar6._8_8_ + lVar1);
  }
  cVar2 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                  *)(this + 0x100),&local_58);
  if (cVar2._M_node == (_Base_ptr)(this + 0x108)) {
    type = _S_red;
  }
  else {
    type = cVar2._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (type != _S_red) {
    createDynamicMemAlloc(__return_storage_ptr__,this,CInst,type);
    return __return_storage_ptr__;
  }
  if (((byte)func[0x21] & 0x20) != 0) {
    createIntrinsic(__return_storage_ptr__,this,(Instruction *)CInst);
    return __return_storage_ptr__;
  }
  auVar6 = llvm::Value::getName();
  plVar3 = auVar6._0_8_;
  if (auVar6._8_8_ == 0xc) {
    if ((int)plVar3[1] == 0x6b68635f && *plVar3 == 0x7970636d656d5f5f) goto LAB_001217be;
  }
  else if ((auVar6._8_8_ == 6) &&
          ((*(short *)((long)plVar3 + 4) == 0x7970 && (int)*plVar3 == 0x636d656d ||
           (*(short *)((long)plVar3 + 4) == 0x6576 && (int)*plVar3 == 0x6f6d656d)))) {
LAB_001217be:
    pCVar5 = CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5);
    val = *(Value **)pCVar5;
    val_00 = *(Value **)(pCVar5 + 0x20);
    lVar1 = *(long *)(pCVar5 + 0x40);
    pcVar4 = Offset::UNKNOWN;
    if ((lVar1 != 0) && (*(char *)(lVar1 + 0x10) == '\x10')) {
      pcVar4 = (pointer)llvm::APInt::getLimitedValue((APInt *)(lVar1 + 0x18),0xffffffffffffffff);
    }
    local_58._M_dataplus._M_p = pcVar4;
    local_60 = getOperand(this,val_00);
    local_38 = getOperand(this,val);
    n = PointerGraph::
        create<(dg::pta::PSNodeType)20,dg::pta::PSNode*,dg::pta::PSNode*,unsigned_long&>
                  ((PointerGraph *)this,&local_60,&local_38,(unsigned_long *)&local_58);
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,n);
    return __return_storage_ptr__;
  }
  local_60 = createUnknownCall(this);
LAB_00121760:
  local_58._M_dataplus._M_p = (pointer)&local_60;
  local_58._M_string_length = 1;
  PSNodesSeq::PSNodesSeq(__return_storage_ptr__,(initializer_list<dg::pta::PSNode_*> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createUndefFunctionCall(const llvm::CallInst *CInst,
                                                 const llvm::Function *func) {
    assert(func->empty());
    // is it a call to free? If so, create invalidate node instead.
    if (invalidate_nodes && func->getName().equals("free")) {
        return {createFree(CInst)};
    }
    if (threads_) {
        if (func->getName().equals("pthread_create")) {
            return createPthreadCreate(CInst);
        }
        if (func->getName().equals("pthread_join")) {
            return createPthreadJoin(CInst);
        }
        if (func->getName().equals("pthread_exit")) {
            return createPthreadExit(CInst);
        }
    }
    /// memory allocation (malloc, calloc, etc.)
    auto type = _options.getAllocationFunction(func->getName().str());
    if (type != AllocationFunction::NONE) {
        return createDynamicMemAlloc(CInst, type);
    }
    if (func->isIntrinsic()) {
        return createIntrinsic(CInst);
    }

    // mempy/memmove
    const auto &funname = func->getName();
    if (funname.equals("memcpy") || funname.equals("__memcpy_chk") ||
        funname.equals("memove")) {
        auto *dest = CInst->getOperand(0);
        auto *src = CInst->getOperand(1);
        auto lenVal = llvmutils::getConstantValue(CInst->getOperand(2));
        return PS.create<PSNodeType::MEMCPY>(getOperand(src), getOperand(dest),
                                             lenVal);
    }

    return {createUnknownCall()};
}